

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irStatement * build_ir_forstmt(Context_conflict *ctx,MOJOSHADER_astForStatement *ast)

{
  int iVar1;
  int iVar2;
  int iVar3;
  LoopLabels *pLVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irExpression *pMVar6;
  MOJOSHADER_irExpression *pMVar7;
  Context_conflict *pCVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *pMVar12;
  MOJOSHADER_irStatement *pMVar13;
  MOJOSHADER_irStatement *pMVar14;
  MOJOSHADER_irStatement *next;
  
  if (ast->looptest->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->looptest->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1376,
                  "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                 );
  }
  iVar1 = ctx->ir_label_count;
  ctx->ir_label_count = iVar1 + 2;
  pLVar4 = push_ir_loop(ctx,0);
  if (pLVar4 == (LoopLabels *)0x0) {
    return (MOJOSHADER_irStatement *)0x0;
  }
  iVar2 = pLVar4->start;
  iVar3 = pLVar4->end;
  if (ast->var_decl == (MOJOSHADER_astVariableDeclaration *)0x0) {
LAB_001481f1:
    if (ast->initializer == (MOJOSHADER_astExpression *)0x0) {
LAB_00148633:
      __assert_fail("(ast->var_decl && !ast->initializer) || (!ast->var_decl && ast->initializer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x138f,
                    "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                   );
    }
  }
  else if (ast->initializer != (MOJOSHADER_astExpression *)0x0) {
    if (ast->var_decl != (MOJOSHADER_astVariableDeclaration *)0x0) goto LAB_00148633;
    goto LAB_001481f1;
  }
  pMVar5 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar5 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar5->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar5->ir).filename = ctx->sourcefile;
    (pMVar5->ir).line = ctx->sourceline;
    (pMVar5->jump).label = iVar1;
  }
  pMVar6 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->looptest);
  if (pMVar6 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar6->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) goto LAB_001485b7;
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar6->ir).type) goto LAB_001485d6;
  }
  pMVar7 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar7 == (MOJOSHADER_irExpression *)0x0) {
    ctx->out_of_memory = 1;
    pMVar7 = (MOJOSHADER_irExpression *)0x0;
    pCVar8 = ctx;
  }
  else {
    (pMVar7->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar7->ir).filename = ctx->sourcefile;
    (pMVar7->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar7 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar7 + 0x1c) = 1;
    pCVar8 = (Context_conflict *)&(pMVar7->temp).index;
  }
  pCVar8->isfail = 1;
  pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar9 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar9->ir).type = MOJOSHADER_IR_CJUMP;
    (pMVar9->ir).filename = ctx->sourcefile;
    (pMVar9->ir).line = ctx->sourceline;
    (pMVar9->jump).label = 0;
    (pMVar9->move).src = pMVar6;
    (pMVar9->cjump).right = pMVar7;
    (pMVar9->cjump).iftrue = iVar1 + 1;
    (pMVar9->cjump).iffalse = iVar3;
  }
  pMVar10 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar10 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar10 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar10->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar10->ir).filename = ctx->sourcefile;
    (pMVar10->ir).line = ctx->sourceline;
    (pMVar10->jump).label = iVar1 + 1;
  }
  pMVar11 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->statement);
  if (pMVar11 != (MOJOSHADER_irStatement *)0x0) {
    if ((pMVar11->ir).type < MOJOSHADER_IR_MOVE) goto LAB_001485f5;
    if (MOJOSHADER_IR_DISCARD < (pMVar11->ir).type) goto LAB_00148614;
  }
  pMVar12 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar12 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar12 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar12->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar12->ir).filename = ctx->sourcefile;
    (pMVar12->ir).line = ctx->sourceline;
    (pMVar12->jump).label = iVar2;
  }
  pMVar6 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->counter);
  if (pMVar6 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar6->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
LAB_001485b7:
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar6->ir).type) {
LAB_001485d6:
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  pMVar13 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar13 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar13 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar13->ir).type = MOJOSHADER_IR_EXPR_STMT;
    (pMVar13->ir).filename = ctx->sourcefile;
    (pMVar13->ir).line = ctx->sourceline;
    (pMVar13->move).dst = pMVar6;
  }
  pMVar14 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar14 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar14 = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (pMVar14->ir).type = MOJOSHADER_IR_JUMP;
    (pMVar14->ir).filename = ctx->sourcefile;
    (pMVar14->ir).line = ctx->sourceline;
    (pMVar14->jump).label = iVar1;
  }
  next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (next == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    next = (MOJOSHADER_irStatement *)0x0;
  }
  else {
    (next->ir).type = MOJOSHADER_IR_LABEL;
    (next->ir).filename = ctx->sourcefile;
    (next->ir).line = ctx->sourceline;
    (next->jump).label = iVar3;
  }
  pMVar14 = new_ir_seq(ctx,pMVar14,next);
  pMVar13 = new_ir_seq(ctx,pMVar13,pMVar14);
  pMVar12 = new_ir_seq(ctx,pMVar12,pMVar13);
  pMVar11 = new_ir_seq(ctx,pMVar11,pMVar12);
  pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
  pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
  pMVar5 = new_ir_seq(ctx,pMVar5,pMVar9);
  if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
    __assert_fail("(first != NULL) || (next != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1285,
                  "MOJOSHADER_irStatement *new_ir_seq(Context *, MOJOSHADER_irStatement *, MOJOSHADER_irStatement *)"
                 );
  }
  pop_ir_loop(ctx);
  pMVar9 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->next);
  if (pMVar9 != (MOJOSHADER_irStatement *)0x0) {
    if ((pMVar9->ir).type < MOJOSHADER_IR_MOVE) {
LAB_001485f5:
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_STMT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11f4,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
    }
    if (MOJOSHADER_IR_DISCARD < (pMVar9->ir).type) {
LAB_00148614:
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_STMT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11f5,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
    }
  }
  pMVar5 = new_ir_seq(ctx,pMVar5,pMVar9);
  return pMVar5;
}

Assistant:

static MOJOSHADER_irStatement *build_ir_forstmt(Context *ctx,
                                       const MOJOSHADER_astForStatement *ast)
{
    // !!! FIXME: ast->unroll

    assert(ast->looptest->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    /* The gist...
            initializer  // (or var_decl->initializer!)
        test:
            cjump looptest == true, loop, join
        loop:
            statement
        increment:  // needs to be here; this is where "continue" jumps!
            counter
            jump test
        join:
    */

    const int test = generate_ir_label(ctx);
    const int loop = generate_ir_label(ctx);

    const LoopLabels *labels = push_ir_loop(ctx, 0);
    if (labels == NULL)
        return NULL;  // out of memory...

    const int increment = labels->start;
    const int join = labels->end;

    assert( (ast->var_decl && !ast->initializer) ||
            (!ast->var_decl && ast->initializer) );

    MOJOSHADER_irStatement *init = NULL;
    if (ast->var_decl != NULL)
    {
//sdfsdf
        // !!! FIXME: map the initializer to the variable? Need fix to var_decl parsing.
//        new_ir_move(ctx, FIXME MAP TO REGISTER ast->var_decl->index, build_ir_expr(ctx, ast->fsdf));
//        FIXME
//        init = build_ir_vardecl(ctx, ast->var_decl);
    } // if
    else
    {
//        init = build_ir_expr(ctx, ast->initializer);
    } // else

    MOJOSHADER_irStatement *retval =
        new_ir_seq(ctx, init,
        new_ir_seq(ctx, new_ir_label(ctx, test),
        new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->looptest), new_ir_constbool(ctx, 1), loop, join),
        new_ir_seq(ctx, new_ir_label(ctx, loop),
        new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
        new_ir_seq(ctx, new_ir_label(ctx, increment),
        new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->counter)),
        new_ir_seq(ctx, new_ir_jump(ctx, test),
                        new_ir_label(ctx, join)))))))));

    pop_ir_loop(ctx);

    return new_ir_seq(ctx, retval, build_ir_stmt(ctx, ast->next));
}